

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread.cpp
# Opt level: O2

void indk::ComputeBackendMultithread::tWorker(void *object)

{
  Neuron *this;
  int64_t tT;
  pair<float,_float> pVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint _DimensionsCount;
  Position *this_00;
  Position *this_01;
  Position *this_02;
  int64_t iVar5;
  int64_t iVar6;
  Entry *pEVar7;
  Receptor *this_03;
  Position *P;
  Synapse *this_04;
  Position *this_05;
  ulong uVar8;
  ulong uVar9;
  int j;
  long EID;
  float fVar10;
  float fVar11;
  float Gamma;
  float dGamma;
  float local_d8;
  float local_d4;
  int local_c4;
  vector<long,_std::allocator<long>_> times;
  int i;
  int j_1;
  float local_78;
  long local_48;
  unique_lock<std::mutex> lk;
  
  do {
    std::unique_lock<std::mutex>::unique_lock(&lk,(mutex_type *)((long)object + 0x30));
    std::condition_variable::wait((unique_lock *)((long)object + 0x58));
    this_00 = (Position *)operator_new(0x10);
    Position::Position(this_00,0,3);
    this_01 = (Position *)operator_new(0x10);
    Position::Position(this_01,0,3);
    this_02 = (Position *)operator_new(0x10);
    Position::Position(this_02,0,3);
    times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_c4 = 0;
    while (uVar8 = *(long *)((long)object + 8) - *object >> 3, (ulong)(long)local_c4 < uVar8) {
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        if ((ulong)((long)times.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)times.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) <= uVar9) {
          local_48 = 0;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>(&times,&local_48);
        }
        this = *(Neuron **)(*object + uVar9 * 8);
        tT = times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar9];
        iVar5 = Neuron::getSignalBufferSize(this);
        if ((tT < iVar5) && (iVar3 = Neuron::getState(this,tT), iVar3 == 1)) {
          uVar4 = Neuron::getXm(this);
          _DimensionsCount = Neuron::getDimensionsCount(this);
          Position::setXm(this_00,uVar4);
          Position::setDimensionsCount(this_00,_DimensionsCount);
          Position::setXm(this_01,uVar4);
          Position::setDimensionsCount(this_01,_DimensionsCount);
          Position::setXm(this_02,uVar4);
          Position::setDimensionsCount(this_02,_DimensionsCount);
          for (EID = 0; iVar6 = Neuron::getEntriesCount(this), EID < iVar6; EID = EID + 1) {
            pEVar7 = Neuron::getEntry(this,EID);
            Neuron::Entry::doProcess(pEVar7);
          }
          local_d8 = 0.0;
          for (_i = 0; iVar6 = Neuron::getReceptorsCount(this), _i < iVar6; _i = _i + 1) {
            this_03 = Neuron::getReceptor(this,_i);
            bVar2 = Neuron::Receptor::isLocked(this_03);
            if (bVar2) {
              P = Neuron::Receptor::getPosf(this_03);
            }
            else {
              P = Neuron::Receptor::getPos(this_03);
            }
            Position::doZeroPosition(this_01);
            local_d4 = 0.0;
            for (_j_1 = 0; iVar6 = Neuron::getEntriesCount(this), _j_1 < iVar6; _j_1 = _j_1 + 1) {
              pEVar7 = Neuron::getEntry(this,_j_1);
              uVar4 = 0;
              while( true ) {
                iVar6 = Neuron::Entry::getSynapsesCount(pEVar7);
                if (iVar6 <= (long)(ulong)uVar4) break;
                this_04 = Neuron::Entry::getSynapse(pEVar7,(ulong)uVar4);
                this_05 = Neuron::Synapse::getPos(this_04);
                fVar10 = Position::getDistanceFrom(this_05,P);
                fVar11 = Neuron::Synapse::getLambda(this_04);
                Gamma = Neuron::Synapse::getGamma(this_04);
                dGamma = Neuron::Synapse::getdGamma(this_04);
                pVar1 = Computer::getFiFunctionValue(fVar11,Gamma,dGamma,fVar10);
                if (0.0 < pVar1.second) {
                  fVar11 = Computer::getFiVectorLength(pVar1.second);
                  Computer::getNewPosition(this_02,P,this_05,fVar11,fVar10);
                  Position::doAdd(this_01,this_02);
                }
                local_78 = pVar1.first;
                local_d4 = local_d4 + local_78;
                uVar4 = uVar4 + 1;
              }
            }
            Neuron::Receptor::setFi(this_03,local_d4);
            Neuron::Receptor::doUpdatePos(this_03,this_01);
            bVar2 = Neuron::Receptor::doCheckActive(this_03);
            fVar10 = Neuron::Receptor::getdFi(this_03);
            fVar10 = Computer::getReceptorInfluenceValue(bVar2,fVar10,this_01,this_00);
            Neuron::Receptor::doUpdateSensitivityValue(this_03);
            local_d8 = local_d8 + fVar10;
          }
          iVar6 = Neuron::getReceptorsCount(this);
          Neuron::doFinalizeInput(this,local_d8 / (float)iVar6);
          times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] = tT + 1;
          local_c4 = local_c4 + (uint)(iVar5 <= tT + 1);
        }
      }
    }
    Position::~Position(this_00);
    operator_delete(this_00,0x10);
    Position::~Position(this_02);
    operator_delete(this_02,0x10);
    Position::~Position(this_01);
    operator_delete(this_01,0x10);
    LOCK();
    *(undefined1 *)((long)object + 0x28) = 1;
    UNLOCK();
    Event::doNotifyOne(*(Event **)((long)object + 0x20));
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&times.super__Vector_base<long,_std::allocator<long>_>);
    std::unique_lock<std::mutex>::~unique_lock(&lk);
  } while( true );
}

Assistant:

[[noreturn]] void indk::ComputeBackendMultithread::tWorker(void* object) {
    auto worker = (indk::Worker*)object;

    while (true) {
        std::unique_lock<std::mutex> lk(worker->m);
        worker -> cv.wait(lk);

        auto zPos = new indk::Position(0, 3);
        auto dRPos = new indk::Position(0, 3);
        auto nRPos = new indk::Position(0, 3);

        std::vector<int64_t> times;
        int tdone = 0;
        uint64_t size = worker -> objects.size();
        while (tdone < size) {
            for (uint64_t n = 0; n < size; n++) {
                if (n >= times.size()) times.push_back(0);
                auto N = (indk::Neuron*)worker -> objects[n];
                auto t = times[n];
                auto ComputeSize = N -> getSignalBufferSize();

                if (t >= ComputeSize) continue;

                if (N->getState(t) != indk::Neuron::States::Pending) {
                    continue;
                }

                float FiSum, D, P = 0;
                auto Xm = N -> getXm();
                auto DimensionsCount = N -> getDimensionsCount();

                zPos -> setXm(Xm);
                zPos -> setDimensionsCount(DimensionsCount);
                dRPos -> setXm(Xm);
                dRPos -> setDimensionsCount(DimensionsCount);
                nRPos -> setXm(Xm);
                nRPos -> setDimensionsCount(DimensionsCount);

                indk::Position *RPos;

                for (int j = 0; j < N->getEntriesCount(); j++) {
                    auto E = N -> getEntry(j);
                    E -> doProcess();
                }

                for (int i = 0; i < N->getReceptorsCount(); i++) {
                    auto R = N->getReceptor(i);
                    if (!R->isLocked()) RPos = R -> getPos();
                    else RPos = R -> getPosf();
                    indk::Position *SPos;
                    std::pair<float, float> FiValues;
                    FiSum = 0;
                    dRPos -> doZeroPosition();

                    for (int j = 0; j < N->getEntriesCount(); j++) {
                        auto E = N -> getEntry(j);

                        for (unsigned int k = 0; k < E->getSynapsesCount(); k++) {
                            auto *S = E -> getSynapse(k);
                            SPos = S -> getPos();
                            D = SPos -> getDistanceFrom(RPos);
                            FiValues = indk::Computer::getFiFunctionValue(S->getLambda(), S->getGamma(), S->getdGamma(), D);
                            if (FiValues.second > 0) {
                                indk::Computer::getNewPosition(nRPos, RPos, SPos, indk::Computer::getFiVectorLength(FiValues.second), D);
                                dRPos -> doAdd(nRPos);
                            }
                            FiSum += FiValues.first;
                        }
                    }

                    R -> setFi(FiSum);
                    R -> doUpdatePos(dRPos);
                    P += indk::Computer::getReceptorInfluenceValue(R->doCheckActive(), R->getdFi(), dRPos, zPos);
                    R -> doUpdateSensitivityValue();
                }
                P /= (float)N->getReceptorsCount();

                N -> doFinalizeInput(P);
                t++;
                times[n] = t;
                if (t >= ComputeSize) {
                    tdone++;
                }
            }
            size = worker -> objects.size();
        }

        delete zPos;
        delete nRPos;
        delete dRPos;

        worker -> done.store(true);
        ((indk::Event*)worker->event) -> doNotifyOne();
    }
}